

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up(string *str,char delimiter)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  allocator<char> *paVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string value;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  size_t end;
  size_type bracketLoc;
  anon_class_1_1_06a9eca7_for__M_pred find_ws;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe90;
  value_type *in_stack_fffffffffffffe98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  undefined1 local_109 [56];
  allocator<char> local_d1;
  char *local_d0;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string local_78 [32];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  undefined8 local_30;
  undefined1 local_13;
  
  trim((string *)0x172f5d);
  local_13 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x172f6f);
  while (bVar1 = ::std::__cxx11::string::empty(), ((bVar1 ^ 0xff) & 1) != 0) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
    lVar4 = ::std::__cxx11::string::find_first_of('X',(ulong)(uint)(int)*pcVar3);
    if (lVar4 == -1) {
      ::std::begin<std::__cxx11::string>(in_stack_fffffffffffffe88);
      ::std::end<std::__cxx11::string>(in_stack_fffffffffffffe88);
      _Var7 = ::std::
              find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>
                        (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                         (anon_class_1_1_06a9eca7_for__M_pred)
                         (char)((ulong)in_stack_fffffffffffffe98 >> 0x38));
      in_stack_fffffffffffffea0 = _Var7;
      ::std::end<std::__cxx11::string>(in_stack_fffffffffffffe88);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffe90,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffe88);
      if (bVar2) {
        in_stack_ffffffffffffff38 = ::std::__cxx11::string::begin();
        in_stack_fffffffffffffe98 = (value_type *)&local_d1;
        local_d0 = _Var7._M_current;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (allocator<char> *)in_stack_fffffffffffffea8._M_current);
        ::std::allocator<char>::~allocator(&local_d1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffea0._M_current,in_stack_fffffffffffffe98);
        local_109._9_8_ =
             __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffe98,(difference_type)in_stack_fffffffffffffe90);
        local_109._1_8_ = ::std::__cxx11::string::end();
        in_stack_fffffffffffffe90 =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_109;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  (in_stack_fffffffffffffeb0,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (allocator<char> *)in_stack_fffffffffffffea8._M_current);
        ::std::__cxx11::string::operator=(in_RSI,(string *)(local_109 + 0x11));
        ::std::__cxx11::string::~string((string *)(local_109 + 0x11));
        ::std::allocator<char>::~allocator((allocator<char> *)local_109);
        ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffea0._M_current,in_stack_fffffffffffffe98);
        ::std::__cxx11::string::clear();
      }
    }
    else {
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
      in_stack_fffffffffffffeb8._M_current = (char *)0x0;
      local_30 = ::std::__cxx11::string::find_first_of('X',(ulong)(uint)(int)*pcVar3);
      ::std::__cxx11::string::operator[](0x1b7978);
      in_stack_fffffffffffffeb0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           close_sequence(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                          SUB81(in_stack_ffffffffffffff38,7));
      in_stack_fffffffffffffec0._M_current = (char *)in_stack_fffffffffffffeb0;
      local_38 = in_stack_fffffffffffffeb0;
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::__cxx11::string::size();
      if (in_stack_fffffffffffffeb0 < pbVar5) {
        ::std::__cxx11::string::substr((ulong)local_58,(ulong)in_RSI);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        ::std::__cxx11::string::~string(local_58);
        in_stack_fffffffffffffea8._M_current = &local_38->field_0x2;
        paVar6 = (allocator<char> *)::std::__cxx11::string::size();
        if (in_stack_fffffffffffffea8._M_current < paVar6) {
          ::std::__cxx11::string::substr((ulong)local_78,(ulong)in_RSI);
          ::std::__cxx11::string::operator=(in_RSI,local_78);
          ::std::__cxx11::string::~string(local_78);
        }
        else {
          ::std::__cxx11::string::clear();
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        ::std::__cxx11::string::clear();
      }
    }
    trim((string *)0x1733a1);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::vector<std::string> split_up(std::string str, char delimiter) {

    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? std::isspace<char>(ch, std::locale()) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    while(!str.empty()) {
        if(bracketChars.find_first_of(str[0]) != std::string::npos) {
            auto bracketLoc = bracketChars.find_first_of(str[0]);
            auto end = close_sequence(str, 0, matchBracketChars[bracketLoc]);
            if(end >= str.size()) {
                output.push_back(std::move(str));
                str.clear();
            } else {
                output.push_back(str.substr(0, end + 1));
                if(end + 2 < str.size()) {
                    str = str.substr(end + 2);
                } else {
                    str.clear();
                }
            }

        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str.clear();
            }
        }
        trim(str);
    }
    return output;
}